

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

float Abc_NtkComputeNodeDeparture(Abc_Obj_t *pObj,float Slew)

{
  Abc_Obj_t *pObj_00;
  int iVar1;
  long lVar2;
  float fVar3;
  
  fVar3 = Bus_SclObjDept(pObj);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    __assert_fail("Bus_SclObjDept(pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                  ,0xb6,"float Abc_NtkComputeNodeDeparture(Abc_Obj_t *, float)");
  }
  lVar2 = 0;
  do {
    if ((pObj->vFanouts).nSize <= lVar2) {
      fVar3 = Bus_SclObjDept(pObj);
      return fVar3;
    }
    pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar2]];
    iVar1 = Abc_ObjIsBarBuf(pObj_00);
    if (iVar1 == 0) {
      if ((*(uint *)&pObj_00->field_0x14 & 0xf) - 5 < 0xfffffffe) {
        iVar1 = Abc_NodeFindFanin(pObj_00,pObj);
        fVar3 = Abc_NtkComputeEdgeDept(pObj_00,iVar1,Slew);
        goto LAB_003acfe1;
      }
    }
    else {
      fVar3 = Bus_SclObjDept(pObj_00);
LAB_003acfe1:
      Bus_SclObjUpdateDept(pObj,fVar3);
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

float Abc_NtkComputeNodeDeparture( Abc_Obj_t * pObj, float Slew )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Bus_SclObjDept(pObj) == 0 );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        if ( Abc_ObjIsBarBuf(pFanout) )
            Bus_SclObjUpdateDept( pObj, Bus_SclObjDept(pFanout) );
        else if ( !Abc_ObjIsCo(pFanout) ) // add required times here
            Bus_SclObjUpdateDept( pObj, Abc_NtkComputeEdgeDept(pFanout, Abc_NodeFindFanin(pFanout, pObj), Slew) );
    }
    return Bus_SclObjDept( pObj );
}